

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UCharCharacterIterator::move32(UCharCharacterIterator *this,int32_t delta,EOrigin origin)

{
  char16_t *pcVar1;
  int iVar2;
  bool bVar3;
  int local_28;
  int local_24;
  int32_t __N_3;
  int32_t __N_2;
  int32_t __N_1;
  int32_t __N;
  EOrigin origin_local;
  int32_t delta_local;
  UCharCharacterIterator *this_local;
  
  if (origin == kStart) {
    (this->super_CharacterIterator).pos = (this->super_CharacterIterator).begin;
    __N_2 = delta;
    if (0 < delta) {
      while( true ) {
        bVar3 = false;
        if (((0 < __N_2) &&
            (bVar3 = true,
            (this->super_CharacterIterator).end <= (this->super_CharacterIterator).pos)) &&
           (bVar3 = false, (this->super_CharacterIterator).end < 0)) {
          bVar3 = this->text[(this->super_CharacterIterator).pos] != L'\0';
        }
        if (!bVar3) break;
        pcVar1 = this->text;
        iVar2 = (this->super_CharacterIterator).pos;
        (this->super_CharacterIterator).pos = iVar2 + 1;
        if ((((pcVar1[iVar2] & 0xfc00U) == 0xd800) &&
            ((this->super_CharacterIterator).pos != (this->super_CharacterIterator).end)) &&
           ((this->text[(this->super_CharacterIterator).pos] & 0xfc00U) == 0xdc00)) {
          (this->super_CharacterIterator).pos = (this->super_CharacterIterator).pos + 1;
        }
        __N_2 = __N_2 + -1;
      }
    }
  }
  else if (origin == kCurrent) {
    __N_3 = delta;
    if (delta < 1) {
      local_24 = -delta;
      while( true ) {
        bVar3 = false;
        if (0 < local_24) {
          bVar3 = (this->super_CharacterIterator).begin < (this->super_CharacterIterator).pos;
        }
        if (!bVar3) break;
        pcVar1 = this->text;
        iVar2 = (this->super_CharacterIterator).pos + -1;
        (this->super_CharacterIterator).pos = iVar2;
        if ((((pcVar1[iVar2] & 0xfc00U) == 0xdc00) &&
            ((this->super_CharacterIterator).begin < (this->super_CharacterIterator).pos)) &&
           ((this->text[(this->super_CharacterIterator).pos + -1] & 0xfc00U) == 0xd800)) {
          (this->super_CharacterIterator).pos = (this->super_CharacterIterator).pos + -1;
        }
        local_24 = local_24 + -1;
      }
    }
    else {
      while( true ) {
        bVar3 = false;
        if (((0 < __N_3) &&
            (bVar3 = true,
            (this->super_CharacterIterator).end <= (this->super_CharacterIterator).pos)) &&
           (bVar3 = false, (this->super_CharacterIterator).end < 0)) {
          bVar3 = this->text[(this->super_CharacterIterator).pos] != L'\0';
        }
        if (!bVar3) break;
        pcVar1 = this->text;
        iVar2 = (this->super_CharacterIterator).pos;
        (this->super_CharacterIterator).pos = iVar2 + 1;
        if ((((pcVar1[iVar2] & 0xfc00U) == 0xd800) &&
            ((this->super_CharacterIterator).pos != (this->super_CharacterIterator).end)) &&
           ((this->text[(this->super_CharacterIterator).pos] & 0xfc00U) == 0xdc00)) {
          (this->super_CharacterIterator).pos = (this->super_CharacterIterator).pos + 1;
        }
        __N_3 = __N_3 + -1;
      }
    }
  }
  else if ((origin == kEnd) &&
          ((this->super_CharacterIterator).pos = (this->super_CharacterIterator).end, delta < 0)) {
    local_28 = -delta;
    while( true ) {
      bVar3 = false;
      if (0 < local_28) {
        bVar3 = (this->super_CharacterIterator).begin < (this->super_CharacterIterator).pos;
      }
      if (!bVar3) break;
      pcVar1 = this->text;
      iVar2 = (this->super_CharacterIterator).pos + -1;
      (this->super_CharacterIterator).pos = iVar2;
      if ((((pcVar1[iVar2] & 0xfc00U) == 0xdc00) &&
          ((this->super_CharacterIterator).begin < (this->super_CharacterIterator).pos)) &&
         ((this->text[(this->super_CharacterIterator).pos + -1] & 0xfc00U) == 0xd800)) {
        (this->super_CharacterIterator).pos = (this->super_CharacterIterator).pos + -1;
      }
      local_28 = local_28 + -1;
    }
  }
  return (this->super_CharacterIterator).pos;
}

Assistant:

int32_t
UCharCharacterIterator::move32(int32_t delta, CharacterIterator::EOrigin origin) {
    // this implementation relies on the "safe" version of the UTF macros
    // (or the trustworthiness of the caller)
    switch(origin) {
    case kStart:
        pos = begin;
        if(delta > 0) {
            U16_FWD_N(text, pos, end, delta);
        }
        break;
    case kCurrent:
        if(delta > 0) {
            U16_FWD_N(text, pos, end, delta);
        } else {
            U16_BACK_N(text, begin, pos, -delta);
        }
        break;
    case kEnd:
        pos = end;
        if(delta < 0) {
            U16_BACK_N(text, begin, pos, -delta);
        }
        break;
    default:
        break;
    }

    return pos;
}